

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_attribute *
adios2_inquire_variable_attribute(adios2_io *io,char *name,char *variable_name,char *separator)

{
  adios2_attribute *paVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  string globalName;
  char *in_stack_000009a0;
  adios2_io *in_stack_000009a8;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  char *local_10;
  
  __rhs = &local_81;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,in_RDX,__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,local_20,&local_b9);
  std::operator+(in_stack_ffffffffffffff18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,local_10,(allocator *)&stack0xffffffffffffff1f);
  std::operator+(in_stack_ffffffffffffff18,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff1f);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::c_str();
  paVar1 = adios2_inquire_attribute(in_stack_000009a8,in_stack_000009a0);
  std::__cxx11::string::~string(local_40);
  return paVar1;
}

Assistant:

adios2_attribute *adios2_inquire_variable_attribute(adios2_io *io, const char *name,
                                                    const char *variable_name,
                                                    const char *separator)
{
    // TODO check const char* are not null
    const std::string globalName =
        std::string(variable_name) + std::string(separator) + std::string(name);
    return adios2_inquire_attribute(io, globalName.c_str());
}